

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

string * __thiscall
TgBot::TgTypeParser::parseInputMedia_abi_cxx11_
          (string *__return_storage_ptr__,TgTypeParser *this,Ptr *object)

{
  element_type *peVar1;
  string *psVar2;
  allocator local_39;
  string local_38;
  
  if ((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  switch(((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->type)
  {
  case PHOTO:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[6]>(this,__return_storage_ptr__,&local_38,(char (*) [6])0x277aff);
    break;
  case VIDEO:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[6]>(this,__return_storage_ptr__,&local_38,(char (*) [6])0x277b1b);
    break;
  case ANIMATION:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[10]>(this,__return_storage_ptr__,&local_38,(char (*) [10])"animation");
    break;
  case DOCUMENT:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[9]>(this,__return_storage_ptr__,&local_38,(char (*) [9])0x277ad4);
    break;
  case AUDIO:
    std::__cxx11::string::string((string *)&local_38,"type",&local_39);
    appendToJson<char[6]>(this,__return_storage_ptr__,&local_38,(char (*) [6])0x277ac7);
    break;
  default:
    goto switchD_001ea0e1_default;
  }
  std::__cxx11::string::~string((string *)&local_38);
switchD_001ea0e1_default:
  psVar2 = &local_38;
  std::__cxx11::string::string((string *)psVar2,"media",&local_39);
  appendToJson((TgTypeParser *)psVar2,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->media);
  std::__cxx11::string::~string((string *)&local_38);
  psVar2 = &local_38;
  std::__cxx11::string::string((string *)psVar2,"caption",&local_39);
  appendToJson((TgTypeParser *)psVar2,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->caption);
  std::__cxx11::string::~string((string *)&local_38);
  psVar2 = &local_38;
  std::__cxx11::string::string((string *)psVar2,"parse_mode",&local_39);
  appendToJson((TgTypeParser *)psVar2,__return_storage_ptr__,&local_38,
               &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->parseMode);
  std::__cxx11::string::~string((string *)&local_38);
  peVar1 = (object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1->width != 0) {
    std::__cxx11::string::string((string *)&local_38,"width",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->width);
    std::__cxx11::string::~string((string *)&local_38);
    peVar1 = (object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (peVar1->height != 0) {
    std::__cxx11::string::string((string *)&local_38,"height",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->height);
    std::__cxx11::string::~string((string *)&local_38);
    peVar1 = (object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (peVar1->duration != 0) {
    std::__cxx11::string::string((string *)&local_38,"duration",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->duration);
    std::__cxx11::string::~string((string *)&local_38);
    peVar1 = (object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (peVar1->performer != 0) {
    std::__cxx11::string::string((string *)&local_38,"performer",&local_39);
    appendToJson<int>(this,__return_storage_ptr__,&local_38,
                      &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->performer);
    std::__cxx11::string::~string((string *)&local_38);
    peVar1 = (object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  if (peVar1->supportsStreaming == true) {
    std::__cxx11::string::string((string *)&local_38,"supports_streaming",&local_39);
    appendToJson(this,__return_storage_ptr__,&local_38,
                 &((object->super___shared_ptr<TgBot::InputMedia,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->supportsStreaming);
    std::__cxx11::string::~string((string *)&local_38);
  }
  removeLastComma(this,__return_storage_ptr__);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string TgTypeParser::parseInputMedia(const InputMedia::Ptr& object) const {
    if (!object) {
        return "";
    }
    string result;
    result += '{';
    switch(object->type) {
        case InputMedia::TYPE::PHOTO:
            appendToJson(result, "type", "photo");
        break;
        case InputMedia::TYPE::VIDEO:
            appendToJson(result, "type", "video");
        break;
        case InputMedia::TYPE::ANIMATION:
            appendToJson(result, "type", "animation");
        break;
        case InputMedia::TYPE::DOCUMENT:
            appendToJson(result, "type", "document");
        break;
        case InputMedia::TYPE::AUDIO:
            appendToJson(result, "type", "audio");
        break;
    }   
    appendToJson(result, "media", object->media);
    appendToJson(result, "caption", object->caption);
    appendToJson(result, "parse_mode", object->parseMode);
    if (object->width) {
        appendToJson(result, "width", object->width);
    }
    if (object->height) {
        appendToJson(result, "height", object->height);
    }
    if (object->duration) {
        appendToJson(result, "duration", object->duration);
    }
    if (object->performer) {
        appendToJson(result, "performer", object->performer);
    }
    if (object->supportsStreaming) {
        appendToJson(result, "supports_streaming", object->supportsStreaming);
    }
    removeLastComma(result);
    result += '}';
    return result;
}